

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ships.cpp
# Opt level: O1

map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
* __thiscall
Ships::EnumerateShips
          (map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
           *__return_storage_ptr__,Ships *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  int count;
  pair<const_int,_std::shared_ptr<Ship>_> ship;
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ships;
  key_type local_7c;
  _Rb_tree_color local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  local_60;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
              *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_7c = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_78 = p_Var3[1]._M_color;
      local_70 = (element_type *)p_Var3[1]._M_parent;
      local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[1]._M_left;
      if ((_Base_ptr)local_68._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((_Base_ptr)local_68._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_68._M_pi)->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&((_Base_ptr)local_68._M_pi)->_M_parent =
               *(int *)&((_Base_ptr)local_68._M_pi)->_M_parent + 1;
        }
      }
      local_7c = local_7c + 1;
      pmVar2 = std::
               map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
               ::operator[](__return_storage_ptr__,&local_7c);
      (pmVar2->super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_70;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar2->super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 &local_68);
      if ((_Base_ptr)local_68._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Ship>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Ship>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::shared_ptr<Ship>> Ships::EnumerateShips() {
    auto ships = GetShips();
    std::map<int, std::shared_ptr<Ship>> ship_map;
    int count = 0;
    for(auto ship : ships) {
        count++;
        ship_map[count] = ship.second;
    }
    return ship_map;
}